

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UnicodeString::extract
          (UnicodeString *this,Char16Ptr *dest,int32_t destCapacity,UErrorCode *errorCode)

{
  ushort uVar1;
  int32_t iVar2;
  char16_t *src;
  UChar *dest_00;
  
  uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if ((short)uVar1 < 0) {
    iVar2 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)(short)uVar1 >> 5;
  }
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((-1 < destCapacity && (uVar1 & 1) == 0) &&
       (dest_00 = dest->p_, dest_00 != (UChar *)0x0 || destCapacity == 0)) {
      if ((uVar1 & 2) == 0) {
        src = (this->fUnion).fFields.fArray;
      }
      else {
        src = (this->fUnion).fStackFields.fBuffer;
      }
      if (((0 < iVar2) && (iVar2 <= destCapacity)) && (src != dest_00)) {
        u_memcpy_63(dest_00,src,iVar2);
        dest_00 = dest->p_;
      }
      iVar2 = u_terminateUChars_63(dest_00,destCapacity,iVar2,errorCode);
      return iVar2;
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return iVar2;
}

Assistant:

int32_t
UnicodeString::extract(Char16Ptr dest, int32_t destCapacity,
                       UErrorCode &errorCode) const {
  int32_t len = length();
  if(U_SUCCESS(errorCode)) {
    if(isBogus() || destCapacity<0 || (destCapacity>0 && dest==0)) {
      errorCode=U_ILLEGAL_ARGUMENT_ERROR;
    } else {
      const UChar *array = getArrayStart();
      if(len>0 && len<=destCapacity && array!=dest) {
        u_memcpy(dest, array, len);
      }
      return u_terminateUChars(dest, destCapacity, len, &errorCode);
    }
  }

  return len;
}